

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_ps.c
# Opt level: O2

MPP_RET h265e_set_sps(H265eCtx *ctx,H265eSps *sps,H265eVps *vps)

{
  byte bVar1;
  MppFrameFormat MVar2;
  MppFrameColorPrimaries MVar3;
  MppFrameColorTransferCharacteristic MVar4;
  MppFrameColorSpace MVar5;
  MppEncCfgSet *pMVar6;
  char cVar7;
  RockchipSocType RVar8;
  MppEncCpbInfo *pMVar9;
  RK_U32 *pRVar10;
  long lVar11;
  RK_U8 RVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  RK_U32 RVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  uint local_e0;
  RK_U32 *tmp;
  undefined8 local_c8;
  undefined8 uStack_c0;
  RK_U8 convertToBit [129];
  RK_U32 RVar20;
  
  pMVar6 = ctx->cfg;
  MVar2 = (pMVar6->prep).format;
  local_c8._0_4_ = (pMVar6->rc).fps_out_num;
  local_c8._4_4_ = (pMVar6->rc).fps_out_denom;
  uStack_c0 = 0;
  pMVar9 = mpp_enc_ref_cfg_get_cpb_info(pMVar6->ref_cfg);
  tmp = sps->zscan2raster;
  memset(convertToBit,0xff,0x81);
  RVar12 = '\0';
  for (uVar19 = 4; uVar19 < 0x81; uVar19 = uVar19 * 2) {
    convertToBit[uVar19] = RVar12;
    RVar12 = RVar12 + '\x01';
  }
  iVar18 = (pMVar6->codec).field_1.h265.max_cu_size;
  bVar1 = convertToBit[iVar18];
  RVar8 = mpp_get_soc_type();
  RVar16 = 0;
  uVar13 = (ulong)bVar1;
  do {
    uVar21 = uVar13;
    cVar7 = (char)RVar16;
    RVar16 = RVar16 + 1;
    RVar20 = (RK_U32)uVar21;
    uVar19 = RVar20 + 1;
    uVar13 = (ulong)uVar19;
  } while ((uint)(1 << (cVar7 + 2U & 0x1f)) <
           (uint)((pMVar6->codec).field_1.h265.max_cu_size >> (bVar1 & 0x1f)));
  uVar22 = iVar18 >> (bVar1 - 1 & 0x1f);
  init_zscan2raster(uVar19,1,0,&tmp);
  init_raster2zscan((pMVar6->codec).field_1.h264.hw_cfg.hw_poc_type,uVar19,sps->raster2zscan,
                    sps->zscan2raster);
  init_raster2pelxy((pMVar6->codec).field_1.h264.hw_cfg.hw_poc_type,uVar19,sps->raster2pelx,
                    sps->raster2pely);
  (sps->m_conformanceWindow).m_winBottomOffset = 0;
  (sps->m_conformanceWindow).m_enabledFlag = 0;
  (sps->m_conformanceWindow).m_winLeftOffset = 0;
  (sps->m_conformanceWindow).m_winRightOffset = 0;
  (sps->m_conformanceWindow).m_winTopOffset = 0;
  uVar19 = (pMVar6->prep).width;
  uVar14 = uVar19 % uVar22;
  iVar18 = 0;
  if (uVar14 != 0) {
    iVar18 = uVar22 - uVar14;
    (sps->m_conformanceWindow).m_enabledFlag = 1;
    (sps->m_conformanceWindow).m_winRightOffset = iVar18;
  }
  uVar14 = (pMVar6->prep).height;
  uVar15 = uVar14 % uVar22;
  iVar23 = 0;
  if (uVar15 != 0) {
    iVar23 = uVar22 - uVar15;
    (sps->m_conformanceWindow).m_enabledFlag = 1;
    (sps->m_conformanceWindow).m_winBottomOffset = iVar23;
  }
  local_e0 = (uint)bVar1;
  sps->m_SPSId = 0;
  sps->m_VPSId = 0;
  sps->m_chromaFormatIdc = (uint)(MVar2 != MPP_FMT_YUV400);
  uVar22 = vps->m_maxLayers;
  sps->m_maxTLayers = uVar22;
  sps->m_picWidthInLumaSamples = iVar18 + uVar19;
  sps->m_picHeightInLumaSamples = iVar23 + uVar14;
  uVar19 = (pMVar6->codec).field_1.h264.hw_cfg.hw_poc_type;
  sps->m_maxCUSize = uVar19;
  sps->m_maxCUDepth = RVar20;
  sps->m_addCUDepth = RVar16;
  (sps->m_RPSList).m_numberOfReferencePictureSets = 0;
  (sps->m_RPSList).m_referencePictureSets = (H265eReferencePictureSet *)0x0;
  uVar14 = RVar20 - RVar16;
  iVar18 = 0;
  for (uVar19 = uVar19 >> ((byte)uVar14 & 0x1f); 1 < (int)uVar19; uVar19 = uVar19 >> 1) {
    iVar18 = iVar18 + 1;
  }
  sps->m_log2MinCodingBlockSize = iVar18;
  sps->m_log2DiffMaxMinCodingBlockSize = uVar14;
  sps->m_pcmLog2MaxSize = 5;
  sps->m_pcmLog2MinSize = 3;
  sps->m_bLongTermRefsPresent = 0;
  sps->m_quadtreeTULog2MaxSize = (RVar8 - ROCKCHIP_SOC_RK3576 < 2) + 1 + local_e0;
  sps->m_quadtreeTULog2MinSize = 2;
  sps->m_quadtreeTUMaxDepthInter = 1;
  sps->m_quadtreeTUMaxDepthIntra = 1;
  sps->m_usePCM = 0;
  sps->m_useLossless = 0;
  uVar13 = (ulong)uVar14;
  for (uVar17 = 0; RVar16 = (pMVar6->codec).field_1.h264.hw_cfg.hw_split_out, uVar13 != uVar17;
      uVar17 = uVar17 + 1) {
    sps->m_iAMPAcc[uVar17] = RVar16;
  }
  sps->m_useAMP = RVar16;
  for (; uVar13 < uVar21; uVar13 = uVar13 + 1) {
    sps->m_iAMPAcc[uVar13] = RVar16;
  }
  sps->m_bitDepthY = 8;
  sps->m_bitDepthC = 8;
  sps->m_qpBDOffsetY = 0;
  sps->m_qpBDOffsetC = 0;
  sps->m_bUseSAO = (pMVar6->codec).field_1.h264.entropy_coding_mode;
  sps->m_bTemporalIdNestingFlag = 1;
  for (uVar13 = 0; uVar22 != uVar13; uVar13 = uVar13 + 1) {
    sps->m_maxDecPicBuffering[uVar13] = vps->m_maxDecPicBuffering[uVar13];
    sps->m_numReorderPics[uVar13] = vps->m_numReorderPics[uVar13];
  }
  sps->m_scalingListEnabledFlag =
       (uint)((pMVar6->codec).field_1.h265.trans_cfg.defalut_ScalingList_enable != 0);
  sps->m_pcmBitDepthLuma = 8;
  sps->m_pcmBitDepthChroma = 8;
  sps->m_bPCMFilterDisableFlag = 0;
  sps->m_bitsForPOC = 0x10;
  sps->m_numLongTermRefPicSPS = 0;
  sps->m_maxTrSize = 0x20;
  sps->m_bLongTermRefsPresent = 0;
  sps->m_TMVPFlagsPresent = (pMVar6->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4;
  sps->m_useStrongIntraSmoothing =
       (pMVar6->codec).field_1.h265.cu_cfg.strong_intra_smoothing_enabled_flag;
  if (pMVar9->max_lt_cnt == 0) {
    if (pMVar9->max_st_tid == 0) goto LAB_001c83e4;
    pRVar10 = &sps->m_TMVPFlagsPresent;
  }
  else {
    pRVar10 = &(pMVar6->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4;
    sps->m_numLongTermRefPicSPS = pMVar9->max_lt_cnt;
    sps->m_bLongTermRefsPresent = 1;
    sps->m_TMVPFlagsPresent = 0;
  }
  *pRVar10 = 0;
LAB_001c83e4:
  if ((pMVar6->rc).drop_mode == MPP_ENC_RC_DROP_FRM_PSKIP) {
    (pMVar6->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4 = 0;
    sps->m_TMVPFlagsPresent = 0;
    (pMVar6->codec).field_1.h264.entropy_coding_mode = 0;
    sps->m_bUseSAO = 0;
  }
  sps->m_ptl = &vps->m_ptl;
  sps->m_vuiParametersPresentFlag = 1;
  (sps->vui).m_aspectRatioInfoPresentFlag = 0;
  (sps->vui).m_aspectRatioIdc = 0;
  (sps->vui).m_sarWidth = 0;
  (sps->vui).m_sarHeight = 0;
  (sps->vui).m_sarHeight = 0;
  (sps->vui).m_overscanInfoPresentFlag = 0;
  (sps->vui).m_overscanAppropriateFlag = 0;
  (sps->vui).m_videoSignalTypePresentFlag = 0;
  (sps->vui).m_videoFormat = 5;
  if ((pMVar6->prep).range == MPP_FRAME_RANGE_JPEG) {
    (sps->vui).m_videoFullRangeFlag = 1;
    (sps->vui).m_videoSignalTypePresentFlag = 1;
  }
  MVar3 = (pMVar6->prep).colorprim;
  MVar4 = (pMVar6->prep).colortrc;
  if (((MVar3 < MPP_FRAME_PRI_NB && MVar3 != MPP_FRAME_PRI_UNSPECIFIED) ||
      (MVar4 < MPP_FRAME_TRC_NB && MVar4 != MPP_FRAME_TRC_UNSPECIFIED)) ||
     (MVar5 = (pMVar6->prep).color, MVar5 != MPP_FRAME_SPC_UNSPECIFIED && MVar5 < MPP_FRAME_SPC_NB))
  {
    (sps->vui).m_videoSignalTypePresentFlag = 1;
    (sps->vui).m_colourDescriptionPresentFlag = 1;
    (sps->vui).m_colourPrimaries = MVar3;
    (sps->vui).m_transferCharacteristics = MVar4;
    (sps->vui).m_matrixCoefficients = (pMVar6->prep).color;
  }
  (sps->vui).m_chromaLocInfoPresentFlag = 0;
  (sps->vui).m_chromaSampleLocTypeTopField = 0;
  (sps->vui).m_chromaSampleLocTypeBottomField = 0;
  (sps->vui).m_neutralChromaIndicationFlag = 0;
  (sps->vui).m_fieldSeqFlag = 0;
  (sps->vui).m_frameFieldInfoPresentFlag = 0;
  (sps->vui).m_hrdParametersPresentFlag = 0;
  (sps->vui).m_bitstreamRestrictionFlag = 0;
  (sps->vui).m_tilesFixedStructureFlag = 0;
  (sps->vui).m_motionVectorsOverPicBoundariesFlag = 1;
  (sps->vui).m_restrictedRefPicListsFlag = 1;
  (sps->vui).m_minSpatialSegmentationIdc = 0;
  (sps->vui).m_maxBytesPerPicDenom = 2;
  (sps->vui).m_maxBitsPerMinCuDenom = 1;
  (sps->vui).m_log2MaxMvLengthHorizontal = 0xf;
  (sps->vui).m_log2MaxMvLengthVertical = 0xf;
  iVar18 = (pMVar6->codec).field_1.h265.vui.vui_aspect_ratio;
  if (iVar18 != 0) {
    (sps->vui).m_aspectRatioInfoPresentFlag = 1;
    (sps->vui).m_aspectRatioIdc = iVar18;
  }
  (sps->vui).m_timingInfo.m_timingInfoPresentFlag = 1;
  (sps->vui).m_timingInfo.m_numUnitsInTick = local_c8._4_4_;
  (sps->vui).m_timingInfo.m_timeScale = (undefined4)local_c8;
  for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
    sps->m_maxLatencyIncrease[lVar11] = 0;
  }
  memset(sps->m_ltRefPicPocLsbSps,0,0x108);
  return MPP_OK;
}

Assistant:

MPP_RET h265e_set_sps(H265eCtx *ctx, H265eSps *sps, H265eVps *vps)
{
    RK_U32 i, c;
    MppEncH265Cfg *codec = &ctx->cfg->codec.h265;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    MppEncRcCfg *rc = &ctx->cfg->rc;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncH265VuiCfg *vui = &codec->vui;
    MppFrameFormat fmt = prep->format;
    RK_S32 i_timebase_num = rc->fps_out_denom;
    RK_S32 i_timebase_den = rc->fps_out_num;
    RK_U8  convertToBit[MAX_CU_SIZE + 1];
    RK_U32 maxCUDepth, minCUDepth, addCUDepth;
    RK_S32 pad[2] = {0};
    RK_S32 minCUSize, log2MinCUSize;
    RK_S32 tuQTMinLog2Size = 2, tuQTMaxLog2Size;
    MppEncCpbInfo *cpb_info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
    RockchipSocType soc_type;
    RK_U32 *tmp = &sps->zscan2raster[0];

    memset(convertToBit, -1, sizeof(convertToBit));
    c = 0;
    for (i = 4; i <= MAX_CU_SIZE; i *= 2) {
        convertToBit[i] = c;
        c++;
    }

    maxCUDepth = (uint32_t)convertToBit[codec->max_cu_size];

    minCUDepth = (codec->max_cu_size >> (maxCUDepth - 1));

    tuQTMaxLog2Size = convertToBit[codec->max_cu_size] + 2 - 1;
    soc_type = mpp_get_soc_type();
    if (soc_type == ROCKCHIP_SOC_RK3576 || soc_type == ROCKCHIP_SOC_RV1126B) {
        tuQTMaxLog2Size = tuQTMaxLog2Size + 1;
    }

    addCUDepth = 0;
    while ((RK_U32)(codec->max_cu_size >> maxCUDepth) > (1u << (tuQTMinLog2Size + addCUDepth))) {
        addCUDepth++;
    }

    maxCUDepth += addCUDepth;
    addCUDepth++;
    init_zscan2raster(maxCUDepth + 1, 1, 0, &tmp );
    init_raster2zscan(codec->max_cu_size, maxCUDepth + 1, &sps->raster2zscan[0], &sps->zscan2raster[0]);
    init_raster2pelxy(codec->max_cu_size, maxCUDepth + 1, &sps->raster2pelx[0], &sps->raster2pely[0]);

    memset(&sps->m_conformanceWindow, 0, sizeof(H265eCropInfo));
    if ((prep->width % minCUDepth) != 0) {
        RK_U32 padsize = 0;
        RK_U32 rem = prep->width % minCUDepth;
        padsize = minCUDepth - rem;
        pad[0] = padsize; //pad width

        /* set the confirmation window offsets  */
        sps->m_conformanceWindow.m_enabledFlag = 1;
        sps->m_conformanceWindow.m_winRightOffset = pad[0];
    }

    if ((prep->height % minCUDepth) != 0) {
        RK_U32 padsize = 0;
        RK_U32 rem = prep->height % minCUDepth;
        padsize = minCUDepth - rem;
        pad[1] = padsize; //pad height

        /* set the confirmation window offsets  */
        sps->m_conformanceWindow.m_enabledFlag = 1;
        sps->m_conformanceWindow.m_winBottomOffset = pad[1];
    }
    // pad[0] = p->sourceWidth - p->oldSourceWidth;
    // pad[1] = p->sourceHeight - p->oldSourceHeight;

    sps->m_SPSId = 0;
    sps->m_VPSId = 0;
    sps->m_chromaFormatIdc = (fmt == MPP_FMT_YUV400) ? H265_CHROMA_400 : H265_CHROMA_420;
    sps->m_maxTLayers = vps->m_maxLayers;
    sps->m_picWidthInLumaSamples = prep->width + pad[0];
    sps->m_picHeightInLumaSamples = prep->height + pad[1];
    sps->m_log2MinCodingBlockSize = 0;
    sps->m_log2DiffMaxMinCodingBlockSize = 0 ;
    sps->m_maxCUSize = codec->max_cu_size;
    sps->m_maxCUDepth = maxCUDepth;
    sps->m_addCUDepth = addCUDepth;
    sps->m_RPSList.m_numberOfReferencePictureSets = 0;
    sps->m_RPSList.m_referencePictureSets = NULL;

    minCUSize = sps->m_maxCUSize >> (sps->m_maxCUDepth - addCUDepth);
    log2MinCUSize = 0;
    while (minCUSize > 1) {
        minCUSize >>= 1;
        log2MinCUSize++;
    }
    sps->m_log2MinCodingBlockSize = log2MinCUSize;
    sps->m_log2DiffMaxMinCodingBlockSize = sps->m_maxCUDepth - addCUDepth;

    sps->m_pcmLog2MaxSize = 5;
    sps->m_usePCM = 0;
    sps->m_pcmLog2MinSize = 3;


    sps->m_bLongTermRefsPresent = 0;
    sps->m_quadtreeTULog2MaxSize =  tuQTMaxLog2Size;
    sps->m_quadtreeTULog2MinSize = tuQTMinLog2Size;
    sps->m_quadtreeTUMaxDepthInter = 1;     //tuQTMaxInterDepth
    sps->m_quadtreeTUMaxDepthIntra = 1;     //tuQTMaxIntraDepth
    sps->m_useLossless = 0;

    for (i = 0; i < (maxCUDepth - addCUDepth); i++) {
        sps->m_iAMPAcc[i] = codec->amp_enable;
    }
    sps->m_useAMP = codec->amp_enable;
    for (i = maxCUDepth - addCUDepth; i < maxCUDepth; i++) {
        sps->m_iAMPAcc[i] = codec->amp_enable;
    }

    sps->m_bitDepthY = 8;
    sps->m_bitDepthC = 8;
    sps->m_qpBDOffsetY = 0;
    sps->m_qpBDOffsetC = 0;

    sps->m_bUseSAO = codec->sao_enable;
    sps->m_bTemporalIdNestingFlag = 1;

    for (i = 0; i < sps->m_maxTLayers; i++) {
        sps->m_maxDecPicBuffering[i] = vps->m_maxDecPicBuffering[i];
        sps->m_numReorderPics[i] = vps->m_numReorderPics[i];
    }

    sps->m_pcmBitDepthLuma = 8;
    sps->m_pcmBitDepthChroma = 8;

    sps->m_bPCMFilterDisableFlag = 0;
    sps->m_scalingListEnabledFlag = codec->trans_cfg.defalut_ScalingList_enable == 0 ? 0 : 1;

    sps->m_bitsForPOC = 16;
    sps->m_numLongTermRefPicSPS = 0;
    sps->m_maxTrSize = 32;
    sps->m_bLongTermRefsPresent = 0;
    sps->m_TMVPFlagsPresent = codec->tmvp_enable;
    sps->m_useStrongIntraSmoothing = codec->cu_cfg.strong_intra_smoothing_enabled_flag;
    if (cpb_info->max_lt_cnt) {
        sps->m_numLongTermRefPicSPS = cpb_info->max_lt_cnt;
        sps->m_bLongTermRefsPresent = 1;
        sps->m_TMVPFlagsPresent = 0;
        codec->tmvp_enable = 0;
    } else if (cpb_info->max_st_tid) {
        sps->m_TMVPFlagsPresent = 0;
    }

    if (rc->drop_mode == MPP_ENC_RC_DROP_FRM_PSKIP) {
        codec->tmvp_enable = 0;
        sps->m_TMVPFlagsPresent = 0;
        codec->sao_enable = 0;
        sps->m_bUseSAO = 0;
    }

    sps->m_ptl = &vps->m_ptl;
    sps->m_vuiParametersPresentFlag = 1;
    if (sps->m_vuiParametersPresentFlag) {
        sps->vui.m_aspectRatioInfoPresentFlag = 0;
        sps->vui.m_aspectRatioIdc = 0;
        sps->vui.m_sarWidth = 0;
        sps->vui.m_sarHeight = 0;
        sps->vui.m_overscanInfoPresentFlag = 0;
        sps->vui.m_overscanAppropriateFlag = 0;
        sps->vui.m_videoSignalTypePresentFlag = 0;
        sps->vui.m_videoFormat = MPP_FRAME_VIDEO_FMT_UNSPECIFIED;
        if (prep->range == MPP_FRAME_RANGE_JPEG) {
            sps->vui.m_videoFullRangeFlag = 1;
            sps->vui.m_videoSignalTypePresentFlag = 1;
        }

        if ((prep->colorprim <= MPP_FRAME_PRI_JEDEC_P22 &&
             prep->colorprim != MPP_FRAME_PRI_UNSPECIFIED) ||
            (prep->colortrc <= MPP_FRAME_TRC_ARIB_STD_B67 &&
             prep->colortrc != MPP_FRAME_TRC_UNSPECIFIED) ||
            (prep->color <= MPP_FRAME_SPC_ICTCP &&
             prep->color != MPP_FRAME_SPC_UNSPECIFIED)) {
            sps->vui.m_videoSignalTypePresentFlag = 1;
            sps->vui.m_colourDescriptionPresentFlag = 1;
            sps->vui.m_colourPrimaries = prep->colorprim;
            sps->vui.m_transferCharacteristics = prep->colortrc;
            sps->vui.m_matrixCoefficients = prep->color;
        }

        sps->vui.m_chromaLocInfoPresentFlag = 0;
        sps->vui.m_chromaSampleLocTypeTopField = 0;
        sps->vui.m_chromaSampleLocTypeBottomField = 0;
        sps->vui.m_neutralChromaIndicationFlag = 0;
        sps->vui.m_fieldSeqFlag = 0;
        sps->vui.m_frameFieldInfoPresentFlag = 0;
        sps->vui.m_hrdParametersPresentFlag = 0;
        sps->vui.m_bitstreamRestrictionFlag = 0;
        sps->vui.m_tilesFixedStructureFlag = 0;
        sps->vui.m_motionVectorsOverPicBoundariesFlag = 1;
        sps->vui.m_restrictedRefPicListsFlag = 1;
        sps->vui.m_minSpatialSegmentationIdc = 0;
        sps->vui.m_maxBytesPerPicDenom = 2;
        sps->vui.m_maxBitsPerMinCuDenom = 1;
        sps->vui.m_log2MaxMvLengthHorizontal = 15;
        sps->vui.m_log2MaxMvLengthVertical = 15;
        if (vui->vui_aspect_ratio) {
            sps->vui.m_aspectRatioInfoPresentFlag = !!vui->vui_aspect_ratio;
            sps->vui.m_aspectRatioIdc = vui->vui_aspect_ratio;
        }
        sps->vui.m_timingInfo.m_timingInfoPresentFlag = 1;
        sps->vui.m_timingInfo.m_numUnitsInTick = i_timebase_num;
        sps->vui.m_timingInfo.m_timeScale = i_timebase_den;
    }



    for (i = 0; i < MAX_SUB_LAYERS; i++) {
        sps->m_maxLatencyIncrease[i] = 0;
    }
    //  sps->m_scalingList = NULL;
    memset(sps->m_ltRefPicPocLsbSps, 0, sizeof(sps->m_ltRefPicPocLsbSps));
    memset(sps->m_usedByCurrPicLtSPSFlag, 0, sizeof(sps->m_usedByCurrPicLtSPSFlag));
    return 0;
}